

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_139a88::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  PixelType PVar4;
  size_t __n;
  PixelType t;
  ulong __n_00;
  Array2D<void_*> *pAVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Header *this;
  Box2i *pBVar12;
  Box2i *pBVar13;
  float *pfVar14;
  V2f *pVVar15;
  V2f *pVVar16;
  LineOrder *pLVar17;
  Compression *pCVar18;
  ChannelList *this_00;
  ChannelList *other;
  string *psVar19;
  string *psVar20;
  TileDescription *pTVar21;
  TileDescription *pTVar22;
  void *pvVar23;
  void *pvVar24;
  ostream *poVar25;
  long lVar26;
  void *pvVar27;
  void **ppvVar28;
  undefined4 uVar29;
  int iVar30;
  undefined7 in_register_00000009;
  char *pcVar31;
  long lVar32;
  long lVar33;
  int i;
  uint uVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  char *pcVar38;
  long lVar39;
  size_t spst;
  ulong uVar40;
  long lVar41;
  long lVar42;
  int j;
  ulong uVar43;
  long lVar44;
  long lVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  long local_368;
  long local_360;
  DeepTiledInputFile file;
  Array<Imf_2_5::Array2D<void_*>_> data;
  long local_328;
  long local_320;
  int local_318;
  int local_2bc;
  string str;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar29 = (undefined4)CONCAT71(in_register_00000009,randomChannels);
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1a3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  Imf_2_5::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  this = Imf_2_5::DeepTiledInputFile::header(&file);
  pBVar12 = Imf_2_5::Header::displayWindow(this);
  pBVar13 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
  iVar51 = -(uint)((pBVar13->min).x == (pBVar12->min).x);
  iVar52 = -(uint)((pBVar13->min).y == (pBVar12->min).y);
  auVar47._4_4_ = iVar51;
  auVar47._0_4_ = iVar51;
  auVar47._8_4_ = iVar52;
  auVar47._12_4_ = iVar52;
  iVar51 = movmskpd(uVar29,auVar47);
  if ((iVar51 != 3) ||
     (iVar52 = -(uint)((pBVar13->max).x == (pBVar12->max).x),
     iVar53 = -(uint)((pBVar13->max).y == (pBVar12->max).y), auVar48._4_4_ = iVar52,
     auVar48._0_4_ = iVar52, auVar48._8_4_ = iVar53, auVar48._12_4_ = iVar53,
     iVar52 = movmskpd((int)pBVar13,auVar48), iVar52 != 3)) {
    __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1aa,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pBVar12 = Imf_2_5::Header::dataWindow(this);
  pBVar13 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
  iVar52 = -(uint)((pBVar13->min).x == (pBVar12->min).x);
  iVar53 = -(uint)((pBVar13->min).y == (pBVar12->min).y);
  auVar49._4_4_ = iVar52;
  auVar49._0_4_ = iVar52;
  auVar49._8_4_ = iVar53;
  auVar49._12_4_ = iVar53;
  iVar51 = movmskpd(iVar51,auVar49);
  if ((iVar51 != 3) ||
     (iVar51 = -(uint)((pBVar13->max).x == (pBVar12->max).x),
     iVar52 = -(uint)((pBVar13->max).y == (pBVar12->max).y), auVar50._4_4_ = iVar51,
     auVar50._0_4_ = iVar51, auVar50._8_4_ = iVar52, auVar50._12_4_ = iVar52,
     iVar51 = movmskpd((int)pBVar13,auVar50), iVar51 != 3)) {
    __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ab,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar14 = Imf_2_5::Header::pixelAspectRatio(this);
  fVar46 = *pfVar14;
  pfVar14 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
  if ((fVar46 != *pfVar14) || (NAN(fVar46) || NAN(*pfVar14))) {
    __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ac,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pVVar15 = Imf_2_5::Header::screenWindowCenter(this);
  pVVar16 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
  if ((((pVVar15->x != pVVar16->x) || (NAN(pVVar15->x) || NAN(pVVar16->x))) ||
      (pVVar15->y != pVVar16->y)) || (NAN(pVVar15->y) || NAN(pVVar16->y))) {
    __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ad,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar14 = Imf_2_5::Header::screenWindowWidth(this);
  fVar46 = *pfVar14;
  pfVar14 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
  if ((fVar46 != *pfVar14) || (NAN(fVar46) || NAN(*pfVar14))) {
    __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1ae,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pLVar17 = Imf_2_5::Header::lineOrder(this);
  LVar2 = *pLVar17;
  pLVar17 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
  if (LVar2 != *pLVar17) {
    __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1af,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pCVar18 = Imf_2_5::Header::compression(this);
  CVar3 = *pCVar18;
  pCVar18 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
  if (CVar3 != *pCVar18) {
    __assert_fail("fileHeader.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this_00 = Imf_2_5::Header::channels(this);
  other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
  bVar6 = Imf_2_5::ChannelList::operator==(this_00,other);
  if (!bVar6) {
    __assert_fail("fileHeader.channels() == header.channels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  psVar19 = Imf_2_5::Header::type_abi_cxx11_(this);
  psVar20 = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
  __n = psVar19->_M_string_length;
  if ((__n != psVar20->_M_string_length) ||
     ((__n != 0 &&
      (iVar51 = bcmp((psVar19->_M_dataplus)._M_p,(psVar20->_M_dataplus)._M_p,__n), iVar51 != 0)))) {
    __assert_fail("fileHeader.type() == header.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pTVar21 = Imf_2_5::Header::tileDescription(this);
  pTVar22 = Imf_2_5::Header::tileDescription((Header *)(anonymous_namespace)::header);
  if ((((pTVar21->xSize != pTVar22->xSize) || (pTVar21->ySize != pTVar22->ySize)) ||
      (pTVar21->mode != pTVar22->mode)) || (pTVar21->roundingMode != pTVar22->roundingMode)) {
    __assert_fail("fileHeader.tileDescription() == header.tileDescription()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                  ,0x1b3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pvVar23 = operator_new__(0x2d0e4);
  uVar7 = random_int(3);
  uVar34 = channelCount + uVar7;
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(long)(int)uVar34);
  if (0 < (int)uVar34) {
    lVar44 = 0;
    do {
      pAVar5 = data._data;
      pvVar24 = operator_new__(0x5a1c8);
      pvVar27 = *(void **)((long)&pAVar5->_data + lVar44);
      if (pvVar27 != (void *)0x0) {
        operator_delete__(pvVar27);
      }
      *(undefined8 *)((long)&pAVar5->_sizeX + lVar44) = 0xa9;
      *(undefined8 *)((long)&pAVar5->_sizeY + lVar44) = 0x111;
      *(void **)((long)&pAVar5->_data + lVar44) = pvVar24;
      lVar44 = lVar44 + 0x18;
    } while ((ulong)uVar34 * 0x18 != lVar44);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar6 = false;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,
             SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
  if (relativeCoords) {
    lVar44 = 0;
  }
  else {
    lVar44 = (long)DAT_004a25b4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar23 + lVar44 * -4),4,0x444,1,1,0.0,bVar6,
             (bool)((char)lVar44 * '\x04'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  __n_00 = (ulong)(uint)channelCount;
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    uVar40 = 0;
    lVar35 = 0x10;
    iVar51 = 0;
    do {
      if (randomChannels) {
        iVar52 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar40] = iVar52;
        if (iVar52 == 1) goto LAB_00150cc4;
      }
      else {
LAB_00150cc4:
        PVar4 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar40 * 4);
        t = (uint)(PVar4 != UINT) * 3;
        if (PVar4 == HALF) {
          t = PVar4;
        }
        if (PVar4 == FLOAT) {
          t = PVar4;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,(int)uVar40);
        std::__cxx11::stringbuf::str();
        iVar52 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
        spst = (ulong)(iVar52 == 0) << 2;
        if (iVar52 == 1) {
          spst = 2;
        }
        if (iVar52 == 2) {
          spst = 4;
        }
        Imf_2_5::DeepSlice::DeepSlice
                  ((DeepSlice *)&box,t,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar35) + lVar44 * -8),8,0x888,
                   spst,1,1,0.0,relativeCoords,relativeCoords);
        Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,(DeepSlice *)&box);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar51 = iVar51 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      uVar40 = uVar40 + 1;
      lVar35 = lVar35 + 0x18;
    } while (__n_00 != uVar40);
    if (iVar51 != 0) {
      if (0 < (int)uVar7) {
        lVar35 = __n_00 * 0x18;
        uVar40 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar25 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_2_5::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar35) + lVar44 * -8),8,0x888,
                     4,1,1,0.0,relativeCoords,relativeCoords);
          Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,&str,(DeepSlice *)&box);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_138);
          uVar40 = uVar40 + 1;
          lVar35 = lVar35 + 0x18;
        } while (uVar7 != uVar40);
      }
      Imf_2_5::DeepTiledInputFile::setFrameBuffer(&file,&frameBuffer);
      pcVar31 = "per-tile ";
      if (relativeCoords) {
        pcVar31 = "per-tile with relative coordinates ";
      }
      lVar44 = 9;
      if (relativeCoords) {
        lVar44 = 0x23;
      }
      pcVar38 = "bulk ";
      if (!bulkRead) {
        pcVar38 = pcVar31;
      }
      lVar35 = 5;
      if (!bulkRead) {
        lVar35 = lVar44;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar38,lVar35);
      std::ostream::flush();
      lVar44 = (ulong)uVar7 * 0x18;
      for (local_368 = 0; iVar51 = Imf_2_5::DeepTiledInputFile::numYLevels(&file),
          local_368 < iVar51; local_368 = local_368 + 1) {
        local_360 = 0;
        while( true ) {
          iVar51 = Imf_2_5::DeepTiledInputFile::numXLevels(&file);
          if (iVar51 <= local_360) break;
          iVar51 = (int)local_360;
          Imf_2_5::DeepTiledInputFile::dataWindowForLevel
                    ((DeepTiledInputFile *)&ss,(int)&file,iVar51);
          iVar52 = (int)local_368;
          if (bulkRead) {
            iVar53 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar51);
            iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar52);
            Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
                      (&file,0,iVar53 + -1,0,iVar8 + -1,iVar51,iVar52);
            for (iVar53 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar52),
                iVar53 < iVar8; iVar53 = iVar53 + 1) {
              for (iVar8 = 0; iVar9 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar51),
                  iVar8 < iVar9; iVar8 = iVar8 + 1) {
                Imf_2_5::DeepTiledInputFile::dataWindowForTile
                          ((DeepTiledInputFile *)&box,(int)&file,iVar8,iVar53,iVar51);
                iVar11 = box.max.x;
                iVar9 = box.min.x;
                local_320 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar35 = (long)box.min.x;
                  lVar32 = (long)(int)_ss;
                  lVar33 = DAT_004a25f0 * local_368;
                  iVar10 = box.max.x + 1;
                  iVar37 = box.max.y + 1;
                  do {
                    if (iVar9 <= iVar11) {
                      lVar45 = local_320 - local_1b4;
                      lVar39 = lVar35;
                      do {
                        lVar36 = lVar39 - lVar32;
                        uVar34 = *(uint *)((long)pvVar23 + lVar36 * 4 + lVar45 * 0x444);
                        uVar40 = (ulong)uVar34;
                        lVar26 = lVar33 * 0x18 + DAT_004a25f8;
                        if (uVar34 != *(uint *)(*(long *)(lVar26 + 8 + local_360 * 0x18) * lVar45 *
                                                4 + *(long *)(lVar26 + 0x10 + local_360 * 0x18) +
                                               lVar36 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x238,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_004a25d8 != (anonymous_namespace)::channelTypes) {
                          lVar41 = 4;
                          uVar43 = 0;
                          lVar26 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar30 = *(int *)(lVar26 + uVar43 * 4);
                            if (iVar30 == 0) {
                              pvVar27 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar30 == 1) {
                              pvVar27 = operator_new__(uVar40 * 2);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar30 == 2) {
                              pvVar27 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            uVar43 = uVar43 + 1;
                            lVar41 = lVar41 + 6;
                          } while (uVar43 < (ulong)(DAT_004a25d8 - lVar26 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar26 = 0;
                          do {
                            pvVar27 = operator_new__(uVar40 << 2);
                            uVar43 = (ulong)(DAT_004a25d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar43]._sizeY + lVar26) * lVar45
                                       * 8 + *(long *)((long)&data._data[uVar43]._data + lVar26) +
                                      lVar36 * 8) = pvVar27;
                            lVar26 = lVar26 + 0x18;
                          } while (lVar44 != lVar26);
                        }
                        lVar39 = lVar39 + 1;
                      } while (iVar10 != (int)lVar39);
                    }
                    local_320 = local_320 + 1;
                  } while (iVar37 != (int)local_320);
                }
              }
            }
            iVar53 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar51);
            iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar52);
            Imf_2_5::DeepTiledInputFile::readTiles(&file,0,iVar53 + -1,0,iVar8 + -1,iVar51,iVar52);
          }
          else if (relativeCoords) {
            for (local_318 = 0; iVar53 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar52),
                local_318 < iVar53; local_318 = local_318 + 1) {
              for (local_2bc = 0; iVar53 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar51),
                  local_2bc < iVar53; local_2bc = local_2bc + 1) {
                Imf_2_5::DeepTiledInputFile::readPixelSampleCount
                          (&file,local_2bc,local_318,iVar51,iVar52);
                Imf_2_5::DeepTiledInputFile::dataWindowForTile
                          ((DeepTiledInputFile *)&box,(int)&file,local_2bc,local_318,iVar51);
                iVar8 = box.max.x;
                iVar53 = box.min.x;
                lVar35 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar32 = (long)box.min.x;
                  lVar33 = (long)(int)_ss;
                  lVar39 = DAT_004a25f0 * local_368;
                  iVar11 = box.max.x + 1;
                  iVar9 = box.max.y + 1;
                  local_328 = lVar35;
                  do {
                    if (iVar53 <= iVar8) {
                      lVar26 = local_328 - lVar35;
                      lVar45 = lVar32;
                      do {
                        lVar41 = lVar45 - lVar32;
                        uVar34 = *(uint *)((long)pvVar23 + lVar41 * 4 + lVar26 * 0x444);
                        uVar40 = (ulong)uVar34;
                        lVar36 = lVar39 * 0x18 + DAT_004a25f8;
                        if (uVar34 != *(uint *)(*(long *)(lVar36 + 8 + local_360 * 0x18) *
                                                (local_328 - local_1b4) * 4 +
                                                *(long *)(lVar36 + 0x10 + local_360 * 0x18) +
                                               (lVar45 - lVar33) * 4)) {
                          __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x28d,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_004a25d8 != (anonymous_namespace)::channelTypes) {
                          lVar42 = 4;
                          uVar43 = 0;
                          lVar36 = (anonymous_namespace)::channelTypes;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar43] == 1)) {
                              iVar37 = *(int *)(lVar36 + uVar43 * 4);
                              if (iVar37 == 0) {
                                pvVar27 = operator_new__(uVar40 * 4);
                                *(void **)(*(long *)((long)data._data + lVar42 * 4 + -8) * lVar26 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar42 * 4) +
                                          lVar41 * 8) = pvVar27;
                                iVar37 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                                lVar36 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar37 == 1) {
                                pvVar27 = operator_new__(uVar40 * 2);
                                *(void **)(*(long *)((long)data._data + lVar42 * 4 + -8) * lVar26 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar42 * 4) +
                                          lVar41 * 8) = pvVar27;
                                iVar37 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                                lVar36 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar37 == 2) {
                                pvVar27 = operator_new__(uVar40 * 4);
                                *(void **)(*(long *)((long)data._data + lVar42 * 4 + -8) * lVar26 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar42 * 4) +
                                          lVar41 * 8) = pvVar27;
                                lVar36 = (anonymous_namespace)::channelTypes;
                              }
                            }
                            uVar43 = uVar43 + 1;
                            lVar42 = lVar42 + 6;
                          } while (uVar43 < (ulong)(DAT_004a25d8 - lVar36 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar36 = 0;
                          do {
                            pvVar27 = operator_new__(uVar40 << 2);
                            uVar43 = (ulong)(DAT_004a25d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar43]._sizeY + lVar36) * lVar26
                                       * 8 + *(long *)((long)&data._data[uVar43]._data + lVar36) +
                                      lVar41 * 8) = pvVar27;
                            lVar36 = lVar36 + 0x18;
                          } while (lVar44 != lVar36);
                        }
                        lVar45 = lVar45 + 1;
                      } while (iVar11 != (int)lVar45);
                    }
                    local_328 = local_328 + 1;
                  } while (iVar9 != (int)local_328);
                }
                Imf_2_5::DeepTiledInputFile::readTile(&file,local_2bc,local_318,iVar51,iVar52);
                iVar8 = box.max.y;
                iVar9 = box.max.x;
                iVar53 = box.min.y;
                if (box.min.y <= box.max.y) {
                  do {
                    lVar35 = (anonymous_namespace)::channelTypes;
                    lVar32 = DAT_004a25d8;
                    lVar33 = DAT_004a25d8;
                    iVar11 = box.min.x;
                    if (box.min.x <= iVar9) {
                      do {
                        lVar45 = (long)iVar53 - (long)box.min.y;
                        lVar26 = (long)iVar11 - (long)box.min.x;
                        lVar39 = lVar35;
                        if (lVar33 != lVar35) {
                          iVar8 = iVar53 - local_1b4;
                          iVar9 = iVar11 - _ss;
                          iVar37 = (iVar8 * 0x111 + iVar9) % 0x801;
                          fVar46 = (float)iVar37;
                          uVar40 = 0;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar40] == 1)) {
                              lVar32 = (long)*(int *)((long)pvVar23 + lVar26 * 4 + lVar45 * 0x444);
                              iVar10 = *(int *)(lVar35 + uVar40 * 4);
                              if (0 < lVar32) {
                                pvVar27 = data._data[uVar40]._data
                                          [data._data[uVar40]._sizeY * lVar45 + lVar26];
                                lVar35 = 0;
                                do {
                                  if (iVar10 == 2) {
                                    fVar1 = *(float *)((long)pvVar27 + lVar35 * 4);
                                    if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                                      poVar25 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25,", ",2);
                                      poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar8);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25," error, should be ",0x12);
                                      poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar37);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25,", is ",5);
                                      poVar25 = std::ostream::_M_insert<double>
                                                          ((double)*(float *)((long)pvVar27 +
                                                                             lVar35 * 4));
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar25 + -0x18) +
                                                      (char)poVar25);
                                      std::ostream::put((char)poVar25);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar1 = *(float *)((long)pvVar27 + lVar35 * 4);
                                    }
                                    if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                                  ,0x197,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if (iVar10 == 1) {
                                    fVar1 = half::_toFloat[*(ushort *)((long)pvVar27 + lVar35 * 2)].
                                            f;
                                    if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                                      poVar25 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25,", ",2);
                                      poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar8);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25," error, should be ",0x12);
                                      poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar37);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar25,", is ",5);
                                      poVar25 = operator<<(poVar25,(half)*(unsigned_short *)
                                                                          ((long)pvVar27 +
                                                                          lVar35 * 2));
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar25 + -0x18) +
                                                      (char)poVar25);
                                      std::ostream::put((char)poVar25);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                      fVar1 = half::_toFloat
                                              [*(ushort *)((long)pvVar27 + lVar35 * 2)].f;
                                    }
                                    if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                                  ,0x18e,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if ((iVar10 == 0) &&
                                          (*(int *)((long)pvVar27 + lVar35 * 4) != iVar37)) {
                                    poVar25 = (ostream *)std::ostream::operator<<(&std::cout,iVar9);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar25,", ",2);
                                    poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar8);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar25," error, should be ",0x12);
                                    poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar37);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar25,", is ",5);
                                    poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25)
                                    ;
                                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18)
                                                    + (char)poVar25);
                                    std::ostream::put((char)poVar25);
                                    std::ostream::flush();
                                    std::ostream::flush();
                                    if (*(int *)((long)pvVar27 + lVar35 * 4) != iVar37) {
                                      __assert_fail(
                                                  "value[l] == static_cast<unsigned int>((dwy * width + dwx) % 2049)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                                  ,0x185,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  lVar35 = lVar35 + 1;
                                } while (lVar32 != lVar35);
                                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                                lVar35 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar10 == 0) {
                                if (data._data[uVar40]._data
                                    [data._data[uVar40]._sizeY * lVar45 + lVar26] == (void *)0x0)
                                goto LAB_00151ba6;
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * lVar45 + lVar26]);
                                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                                lVar35 = (anonymous_namespace)::channelTypes;
                              }
                              if (iVar10 == 1) {
                                if (data._data[uVar40]._data
                                    [data._data[uVar40]._sizeY * lVar45 + lVar26] == (void *)0x0)
                                goto LAB_00151ba6;
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * lVar45 + lVar26]);
                                iVar10 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                                lVar35 = (anonymous_namespace)::channelTypes;
                              }
                              if ((iVar10 == 2) &&
                                 (data._data[uVar40]._data
                                  [data._data[uVar40]._sizeY * lVar45 + lVar26] != (void *)0x0)) {
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * lVar45 + lVar26]);
                                lVar35 = (anonymous_namespace)::channelTypes;
                              }
                            }
LAB_00151ba6:
                            uVar40 = uVar40 + 1;
                            lVar32 = DAT_004a25d8;
                            lVar39 = DAT_004a25d8;
                          } while (uVar40 < (ulong)(DAT_004a25d8 - lVar35 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar33 = 0;
                          lVar39 = lVar32;
                          do {
                            uVar40 = (ulong)(lVar39 - lVar35) >> 2;
                            pvVar27 = *(void **)(*(long *)((long)&data._data[uVar40]._sizeY + lVar33
                                                          ) * (long)(int)lVar45 * 8 +
                                                 *(long *)((long)&data._data[uVar40]._data + lVar33)
                                                + (long)(int)lVar26 * 8);
                            if (pvVar27 != (void *)0x0) {
                              operator_delete__(pvVar27);
                              lVar35 = (anonymous_namespace)::channelTypes;
                              lVar32 = DAT_004a25d8;
                              lVar39 = DAT_004a25d8;
                            }
                            lVar33 = lVar33 + 0x18;
                          } while (lVar44 != lVar33);
                        }
                        bVar6 = iVar11 < box.max.x;
                        lVar33 = lVar39;
                        iVar8 = box.max.y;
                        iVar9 = box.max.x;
                        iVar11 = iVar11 + 1;
                      } while (bVar6);
                    }
                    bVar6 = iVar53 < iVar8;
                    iVar53 = iVar53 + 1;
                  } while (bVar6);
                }
              }
            }
          }
          else {
            for (iVar53 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::numYTiles(&file,iVar52),
                iVar53 < iVar8; iVar53 = iVar53 + 1) {
              for (iVar8 = 0; iVar9 = Imf_2_5::DeepTiledInputFile::numXTiles(&file,iVar51),
                  iVar8 < iVar9; iVar8 = iVar8 + 1) {
                Imf_2_5::DeepTiledInputFile::readPixelSampleCount(&file,iVar8,iVar53,iVar51,iVar52);
                Imf_2_5::DeepTiledInputFile::dataWindowForTile
                          ((DeepTiledInputFile *)&box,(int)&file,iVar8,iVar53,iVar51);
                iVar11 = box.max.x;
                iVar9 = box.min.x;
                local_320 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar35 = (long)box.min.x;
                  lVar32 = (long)(int)_ss;
                  lVar33 = DAT_004a25f0 * local_368;
                  iVar10 = box.max.x + 1;
                  iVar37 = box.max.y + 1;
                  do {
                    if (iVar9 <= iVar11) {
                      lVar45 = local_320 - local_1b4;
                      lVar39 = lVar35;
                      do {
                        lVar36 = lVar39 - lVar32;
                        uVar34 = *(uint *)((long)pvVar23 + lVar36 * 4 + lVar45 * 0x444);
                        uVar40 = (ulong)uVar34;
                        lVar26 = lVar33 * 0x18 + DAT_004a25f8;
                        if (uVar34 != *(uint *)(*(long *)(lVar26 + 8 + local_360 * 0x18) * lVar45 *
                                                4 + *(long *)(lVar26 + 0x10 + local_360 * 0x18) +
                                               lVar36 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                        ,0x264,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_004a25d8 != (anonymous_namespace)::channelTypes) {
                          lVar41 = 4;
                          uVar43 = 0;
                          lVar26 = (anonymous_namespace)::channelTypes;
                          do {
                            iVar30 = *(int *)(lVar26 + uVar43 * 4);
                            if (iVar30 == 0) {
                              pvVar27 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar30 == 1) {
                              pvVar27 = operator_new__(uVar40 * 2);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              iVar30 = *(int *)((anonymous_namespace)::channelTypes + uVar43 * 4);
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            if (iVar30 == 2) {
                              pvVar27 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar41 * 4 + -8) * lVar45 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar41 * 4) +
                                        lVar36 * 8) = pvVar27;
                              lVar26 = (anonymous_namespace)::channelTypes;
                            }
                            uVar43 = uVar43 + 1;
                            lVar41 = lVar41 + 6;
                          } while (uVar43 < (ulong)(DAT_004a25d8 - lVar26 >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar26 = 0;
                          do {
                            pvVar27 = operator_new__(uVar40 << 2);
                            uVar43 = (ulong)(DAT_004a25d8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar43]._sizeY + lVar26) * lVar45
                                       * 8 + *(long *)((long)&data._data[uVar43]._data + lVar26) +
                                      lVar36 * 8) = pvVar27;
                            lVar26 = lVar26 + 0x18;
                          } while (lVar44 != lVar26);
                        }
                        lVar39 = lVar39 + 1;
                      } while (iVar10 != (int)lVar39);
                    }
                    local_320 = local_320 + 1;
                  } while (iVar37 != (int)local_320);
                }
                Imf_2_5::DeepTiledInputFile::readTile(&file,iVar8,iVar53,iVar51,iVar52);
              }
            }
          }
          if (!relativeCoords) {
            for (lVar35 = 0; iVar53 = Imf_2_5::DeepTiledInputFile::levelHeight(&file,iVar52),
                lVar35 < iVar53; lVar35 = lVar35 + 1) {
              iVar53 = (int)lVar35;
              for (lVar32 = 0; iVar8 = Imf_2_5::DeepTiledInputFile::levelWidth(&file,iVar51),
                  lVar32 < iVar8; lVar32 = lVar32 + 1) {
                if (0 < channelCount) {
                  iVar8 = (int)lVar32;
                  uVar34 = (uint)(iVar8 + iVar53 * 0x111) % 0x801;
                  fVar46 = (float)uVar34;
                  uVar40 = 0;
                  do {
                    if (((!randomChannels) ||
                        (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar40] == 1)) &&
                       (*(int *)((long)pvVar23 + lVar32 * 4 + lVar35 * 0x444) != 0)) {
                      uVar43 = 0;
                      do {
                        iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                        if (iVar9 == 0) {
                          pvVar27 = data._data[uVar40]._data
                                    [data._data[uVar40]._sizeY * lVar35 + lVar32];
                          if (*(uint *)((long)pvVar27 + uVar43 * 4) != uVar34) {
                            poVar25 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar53);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar25," error, should be ",0x12);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar34);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", is ",5);
                            poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) +
                                            (char)poVar25);
                            std::ostream::put((char)poVar25);
                            std::ostream::flush();
                            std::ostream::flush();
                            if (*(uint *)((long)pvVar27 + uVar43 * 4) != uVar34) {
                              __assert_fail("value[l] == static_cast<unsigned int>(i * width + j) % 2049"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                            ,0x2d8,
                                            "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                           );
                            }
                          }
                          iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                        }
                        if (iVar9 == 1) {
                          ppvVar28 = data._data[uVar40]._data;
                          lVar33 = data._data[uVar40]._sizeY * lVar35;
                          pvVar27 = ppvVar28[lVar33 + lVar32];
                          if ((half::_toFloat[*(ushort *)((long)pvVar27 + uVar43 * 2)].f != fVar46)
                             || (NAN(half::_toFloat[*(ushort *)((long)pvVar27 + uVar43 * 2)].f) ||
                                 NAN(fVar46))) {
                            poVar25 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar53);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar25," error, should be ",0x12);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar34);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", is ",5);
                            poVar25 = operator<<(poVar25,(half)*(unsigned_short *)
                                                                ((long)pvVar27 + uVar43 * 2));
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) +
                                            (char)poVar25);
                            std::ostream::put((char)poVar25);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar28 = data._data[uVar40]._data;
                            lVar33 = data._data[uVar40]._sizeY * lVar35;
                          }
                          if ((half::_toFloat
                               [*(ushort *)((long)ppvVar28[lVar33 + lVar32] + uVar43 * 2)].f !=
                               fVar46) ||
                             (NAN(half::_toFloat
                                  [*(ushort *)((long)ppvVar28[lVar33 + lVar32] + uVar43 * 2)].f) ||
                              NAN(fVar46))) {
                            __assert_fail("((half*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                          ,0x2e1,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                          iVar9 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                        }
                        if (iVar9 == 2) {
                          ppvVar28 = data._data[uVar40]._data;
                          lVar33 = data._data[uVar40]._sizeY * lVar35;
                          pvVar27 = ppvVar28[lVar33 + lVar32];
                          fVar1 = *(float *)((long)pvVar27 + uVar43 * 4);
                          if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                            poVar25 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,iVar53);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar25," error, should be ",0x12);
                            poVar25 = (ostream *)std::ostream::operator<<(poVar25,uVar34);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar25,", is ",5);
                            poVar25 = std::ostream::_M_insert<double>
                                                ((double)*(float *)((long)pvVar27 + uVar43 * 4));
                            std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) +
                                            (char)poVar25);
                            std::ostream::put((char)poVar25);
                            std::ostream::flush();
                            std::ostream::flush();
                            ppvVar28 = data._data[uVar40]._data;
                            lVar33 = data._data[uVar40]._sizeY * lVar35;
                          }
                          fVar1 = *(float *)((long)ppvVar28[lVar33 + lVar32] + uVar43 * 4);
                          if ((fVar1 != fVar46) || (NAN(fVar1) || NAN(fVar46))) {
                            __assert_fail("((float*)(data[k][i][j]))[l] == (i * width + j) % 2049",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepTiledBasic.cpp"
                                          ,0x2ea,
                                          "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                         );
                          }
                        }
                        uVar43 = uVar43 + 1;
                      } while (uVar43 < *(uint *)((long)pvVar23 + lVar32 * 4 + lVar35 * 0x444));
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != __n_00);
                }
              }
            }
            for (lVar35 = 0; iVar53 = Imf_2_5::DeepTiledInputFile::levelHeight(&file,iVar52),
                lVar35 < iVar53; lVar35 = lVar35 + 1) {
              for (lVar32 = 0; iVar53 = Imf_2_5::DeepTiledInputFile::levelWidth(&file,iVar51),
                  lVar32 < iVar53; lVar32 = lVar32 + 1) {
                if (0 < channelCount) {
                  lVar39 = 4;
                  uVar40 = 0;
                  lVar33 = (anonymous_namespace)::channelTypes;
                  do {
                    iVar53 = *(int *)(lVar33 + uVar40 * 4);
                    if (iVar53 == 0) {
                      pvVar27 = *(void **)(*(long *)((long)data._data + lVar39 * 4 + -8) * lVar35 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar39 * 4) +
                                          lVar32 * 8);
                      if (pvVar27 != (void *)0x0) {
                        operator_delete__(pvVar27);
                        iVar53 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                        lVar33 = (anonymous_namespace)::channelTypes;
                        goto LAB_00152557;
                      }
                    }
                    else {
LAB_00152557:
                      if (iVar53 == 1) {
                        pvVar27 = *(void **)(*(long *)((long)data._data + lVar39 * 4 + -8) * lVar35
                                             * 8 + *(long *)((long)&(data._data)->_sizeX +
                                                            lVar39 * 4) + lVar32 * 8);
                        if (pvVar27 == (void *)0x0) goto LAB_001525bb;
                        operator_delete__(pvVar27);
                        iVar53 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                        lVar33 = (anonymous_namespace)::channelTypes;
                      }
                      if ((iVar53 == 2) &&
                         (pvVar27 = *(void **)(*(long *)((long)data._data + lVar39 * 4 + -8) *
                                               lVar35 * 8 +
                                               *(long *)((long)&(data._data)->_sizeX + lVar39 * 4) +
                                              lVar32 * 8), pvVar27 != (void *)0x0)) {
                        operator_delete__(pvVar27);
                        lVar33 = (anonymous_namespace)::channelTypes;
                      }
                    }
LAB_001525bb:
                    uVar40 = uVar40 + 1;
                    lVar39 = lVar39 + 6;
                  } while (__n_00 != uVar40);
                }
                if (0 < (int)uVar7) {
                  lVar45 = 0;
                  lVar33 = DAT_004a25d8;
                  lVar39 = (anonymous_namespace)::channelTypes;
                  do {
                    uVar40 = (ulong)(lVar33 - lVar39) >> 2;
                    pvVar27 = *(void **)(*(long *)((long)&data._data[uVar40]._sizeY + lVar45) *
                                         lVar35 * 8 +
                                         *(long *)((long)&data._data[uVar40]._data + lVar45) +
                                        lVar32 * 8);
                    if (pvVar27 != (void *)0x0) {
                      operator_delete__(pvVar27);
                      lVar33 = DAT_004a25d8;
                      lVar39 = (anonymous_namespace)::channelTypes;
                    }
                    lVar45 = lVar45 + 0x18;
                  } while (lVar44 != lVar45);
                }
              }
            }
          }
          local_360 = local_360 + 1;
        }
      }
      goto LAB_00152681;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_00152681:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar23);
  Imf_2_5::DeepTiledInputFile::~DeepTiledInputFile(&file);
  return;
}

Assistant:

void readFile (int channelCount,
               bool bulkRead,
               bool relativeCoords,
               bool randomChannels,
               const std::string & filename)
{
    if (relativeCoords)
        assert(bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str(), 4);

    const Header& fileHeader = file.header();
    assert (fileHeader.displayWindow() == header.displayWindow());
    assert (fileHeader.dataWindow() == header.dataWindow());
    assert (fileHeader.pixelAspectRatio() == header.pixelAspectRatio());
    assert (fileHeader.screenWindowCenter() == header.screenWindowCenter());
    assert (fileHeader.screenWindowWidth() == header.screenWindowWidth());
    assert (fileHeader.lineOrder() == header.lineOrder());
    assert (fileHeader.compression() == header.compression());
    assert (fileHeader.channels() == header.channels());
    assert (fileHeader.type() == header.type());
    assert (fileHeader.tileDescription() == header.tileDescription());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase(height, width);
    
    // also test filling channels. Generate up to 2 extra channels
    int fillChannels=random_int(3);
    
    Array<Array2D< void* > > data(channelCount+fillChannels);
    for (int i = 0; i < channelCount+fillChannels; i++)
        data[i].resizeErase(height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                        (char *) (&localSampleCount[0][0] - memOffset),
                                        sizeof (unsigned int) * 1,
                                        sizeof (unsigned int) * width,
                                        1, 1,
                                        0,
                                        relativeCoords,
                                        relativeCoords));

    
    vector<int> read_channel(channelCount);
    int channels_added=0;
    for (int i = 0; i < channelCount; i++)
    {
         if(randomChannels)
        {
	     read_channel[i] = random_int(2);
	     
        }
        if(!randomChannels || read_channel[i]==1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0)
                type = IMF::UINT;
            if (channelTypes[i] == 1)
                type = IMF::HALF;
            if (channelTypes[i] == 2)
                type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char *);

            frameBuffer.insert (str,
                                DeepSlice (type,
                                (char *) (&data[i][0][0] - memOffset),
                                pointerSize * 1,
                                pointerSize * width,
                                sampleSize,
                                1, 1,
                                0,
                                relativeCoords,
                                relativeCoords));
                channels_added++;
            }
    }
     if(channels_added==0)
    {
      cout << "skipping " <<flush;
      return;
    }
    for(int i = 0 ; i < fillChannels ; ++i )
    { 
        PixelType type  = IMF::FLOAT;
        int sampleSize = sizeof(float);            
        int pointerSize = sizeof (char *);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str();
        frameBuffer.insert (str,
                            DeepSlice (type,
                            (char *) (&data[i+channelCount][0][0] - memOffset),
                            pointerSize * 1,
                            pointerSize * width,
                            sampleSize,
                            1, 1,
                            0,
                            relativeCoords,
                            relativeCoords));
    }

    file.setFrameBuffer(frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels(); ly++)
        for (int lx = 0; lx < file.numXLevels(); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel(lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);

                for (int i = 0; i < file.numYTiles(ly); i++)
                {
                    for (int j = 0; j < file.numXTiles(lx); j++)
                    {
                        Box2i box = file.dataWindowForTile(j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size(); k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                                for( int f = 0 ; f < fillChannels ; ++f )
                                {
                                     data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                }
                                
                            }
                            
                    }
                }

                file.readTiles(0, file.numXTiles(lx) - 1, 0, file.numYTiles(ly) - 1, lx, ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert(localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] = new half[localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                       data[f + channelTypes.size()][dwy][dwx] = new float[localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles(ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles(lx); j++)
                        {
                            file.readPixelSampleCount(j, i, lx, ly);

                            Box2i box = file.dataWindowForTile(j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;
                                    assert(localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                          if( !randomChannels || read_channel[k]==1)
                                          {
                                                if (channelTypes[k] == 0)
                                                    data[k][ty][tx] = new unsigned int[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 1)
                                                    data[k][ty][tx] = new half[localSampleCount[ty][tx]];
                                                if (channelTypes[k] == 2)
                                                    data[k][ty][tx] = new float[localSampleCount[ty][tx]];
                                          }
                                            
                                         
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                        data[f + channelTypes.size()][ty][tx] = new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile(j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty = y - box.min.y;
                                    int tx = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size(); k++)
                                    {
                                         if( !randomChannels || read_channel[k]==1)
                                         {
                                                checkValue(data[k][ty][tx],
                                                        localSampleCount[ty][tx],
                                                        channelTypes[k],
                                                        dwx, dwy);
                                                if (channelTypes[k] == 0)
                                                    delete[] (unsigned int*) data[k][ty][tx];
                                                if (channelTypes[k] == 1)
                                                    delete[] (half*) data[k][ty][tx];
                                                if (channelTypes[k] == 2)
                                                    delete[] (float*) data[k][ty][tx];
                                         }
                                    }
                                    for( int f = 0 ; f < fillChannels ; ++f )
                                    {
                                         delete[] (float*) data[f+channelTypes.size()][ty][tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if( !randomChannels || read_channel[k]==1)
                            {
                                for (unsigned int l = 0; l < localSampleCount[i][j]; l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value = (unsigned int*)(data[k][i][j]);
                                        if (value[l] != static_cast<unsigned int>(i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (value[l] == static_cast<unsigned int>(i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((half*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*)(data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i << " error, should be "
                                                << (i * width + j) % 2049 << ", is " << value[l]
                                                << endl << flush;
                                        assert (((float*)(data[k][i][j]))[l] == (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight(ly); i++)
                    for (int j = 0; j < file.levelWidth(lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                                if (channelTypes[k] == 0)
                                    delete[] (unsigned int*) data[k][i][j];
                                if (channelTypes[k] == 1)
                                    delete[] (half*) data[k][i][j];
                                if (channelTypes[k] == 2)
                                    delete[] (float*) data[k][i][j];
                        }
                        for( int f = 0 ; f < fillChannels ; ++f )
                        {
                            delete[] (float*) data[f+channelTypes.size()][i][j];
                        }
                    }
            }
        }
}